

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O0

uint64_t tail64_le(void *v,size_t tail)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint in_ESI;
  byte *in_RDI;
  uint64_t r;
  uint8_t *p;
  long local_28;
  uint64_t local_8;
  
  local_28 = 0;
  switch(in_ESI & 7) {
  case 0:
    local_8 = fetch64_le(in_RDI);
    break;
  case 1:
    local_8 = (uint64_t)*in_RDI;
    break;
  case 3:
    local_28 = (ulong)in_RDI[2] << 0x10;
  case 2:
    uVar1 = fetch16_le(in_RDI);
    local_8 = local_28 + (ulong)uVar1;
    break;
  case 7:
    local_28 = (ulong)in_RDI[6] << 8;
  case 6:
    local_28 = ((ulong)in_RDI[5] + local_28) * 0x100;
  case 5:
    local_28 = (ulong)in_RDI[4] + local_28 << 0x20;
  case 4:
    uVar2 = fetch32_le(in_RDI);
    local_8 = local_28 + (ulong)uVar2;
  }
  return local_8;
}

Assistant:

static __inline uint64_t tail64_le(const void *v, size_t tail) {
  const uint8_t *p = (const uint8_t *)v;
  uint64_t r = 0;
  switch (tail & 7) {
#if UNALIGNED_OK && __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  /* For most CPUs this code is better when not needed
   * copying for alignment or byte reordering. */
  case 0:
    return fetch64_le(p);
  case 7:
    r = (uint64_t)p[6] << 8;
  case 6:
    r += p[5];
    r <<= 8;
  case 5:
    r += p[4];
    r <<= 32;
  case 4:
    return r + fetch32_le(p);
  case 3:
    r = (uint64_t)p[2] << 16;
  case 2:
    return r + fetch16_le(p);
  case 1:
    return p[0];
#else
  /* For most CPUs this code is better than a
   * copying for alignment and/or byte reordering. */
  case 0:
    r = p[7] << 8;
  case 7:
    r += p[6];
    r <<= 8;
  case 6:
    r += p[5];
    r <<= 8;
  case 5:
    r += p[4];
    r <<= 8;
  case 4:
    r += p[3];
    r <<= 8;
  case 3:
    r += p[2];
    r <<= 8;
  case 2:
    r += p[1];
    r <<= 8;
  case 1:
    return r + p[0];
#endif
  }
  unreachable();
}